

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O0

void __thiscall Liby::http::HttpClient::handleConnection(HttpClient *this,ConnPtr *conn)

{
  bool bVar1;
  element_type *peVar2;
  anon_class_8_1_8991fb9c local_78;
  ConnCallback local_70;
  anon_class_8_1_8991fb9c local_40;
  ConnCallback local_38;
  ConnPtr *local_18;
  ConnPtr *conn_local;
  HttpClient *this_local;
  
  local_18 = conn;
  conn_local = (ConnPtr *)this;
  std::shared_ptr<Liby::Connection>::operator=(&this->http_conn_,conn);
  peVar2 = std::__shared_ptr_access<Liby::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Liby::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->http_conn_);
  local_40.this = this;
  std::function<void(Liby::Connection&)>::
  function<Liby::http::HttpClient::handleConnection(std::shared_ptr<Liby::Connection>)::__0,void>
            ((function<void(Liby::Connection&)> *)&local_38,&local_40);
  Connection::onRead(peVar2,&local_38);
  std::function<void_(Liby::Connection_&)>::~function(&local_38);
  peVar2 = std::__shared_ptr_access<Liby::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Liby::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->http_conn_);
  local_78.this = this;
  std::function<void(Liby::Connection&)>::
  function<Liby::http::HttpClient::handleConnection(std::shared_ptr<Liby::Connection>)::__1,void>
            ((function<void(Liby::Connection&)> *)&local_70,&local_78);
  Connection::onErro(peVar2,&local_70);
  std::function<void_(Liby::Connection_&)>::~function(&local_70);
  bVar1 = std::__cxx11::
          list<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
          ::empty(&this->requestLists_);
  if (!bVar1) {
    sendRequest(this);
  }
  return;
}

Assistant:

void HttpClient::handleConnection(ConnPtr conn) {
    http_conn_ = conn;
    http_conn_->onRead([this](Connection &c) { handleReadEvent(c); });
    http_conn_->onErro([this](Connection &c) { handleErroEvent(c); });
    if (!requestLists_.empty())
        sendRequest();
}